

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

vm_obj_id_t CVmBifTADS::format_datetime_list(time_t timer)

{
  vm_obj_id_t vVar1;
  vm_val_t *p;
  vm_val_t *this;
  long in_RDI;
  vm_obj_id_t lst;
  vm_obj_id_t bn;
  char *dst;
  char buf [80];
  tm *tblock;
  vm_val_t *gsp;
  undefined4 in_stack_ffffffffffffff88;
  vm_obj_id_t in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  undefined1 *puVar2;
  int in_root_set;
  undefined4 in_stack_ffffffffffffff98;
  vm_obj_id_t in_stack_ffffffffffffff9c;
  char **in_stack_ffffffffffffffa0;
  long local_8;
  
  local_8 = in_RDI;
  p = CVmStack::get_sp();
  localtime(&local_8);
  vmb_put_len(in_stack_ffffffffffffff90,
              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  puVar2 = &stack0xffffffffffffff9a;
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  put_list_int(in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (local_8 < 0x80000000) {
    put_list_int(in_stack_ffffffffffffffa0,
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_root_set = (int)((ulong)puVar2 >> 0x20);
  }
  else {
    in_stack_ffffffffffffff8c =
         CVmObjBigNum::create_int64
                   ((int)((ulong)puVar2 >> 0x20),(uint32_t)puVar2,in_stack_ffffffffffffff8c);
    in_root_set = (int)((ulong)puVar2 >> 0x20);
    this = CVmStack::push();
    vm_val_t::set_obj(this,in_stack_ffffffffffffff8c);
    put_list_obj(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  vVar1 = CVmObjList::create(in_root_set,
                             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  CVmStack::set_sp(p);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmBifTADS::format_datetime_list(VMG_ os_time_t timer)
{
    /* note the starting stack pointer, so we can discard gc protection */
    vm_val_t *gsp = G_stk->get_sp();
    
    /* convert the time_t to the local time */
    struct tm *tblock = os_localtime(&timer);

    /* start the list buffer - set the length (9 elements) */
    char buf[80];
    vmb_put_len(buf, 9);
    char *dst = buf + VMB_LEN;
    
    /* add the time elements to the list */
    put_list_int(&dst, tblock->tm_year + 1900);
    put_list_int(&dst, tblock->tm_mon + 1);
    put_list_int(&dst, tblock->tm_mday);
    put_list_int(&dst, tblock->tm_wday + 1);
    put_list_int(&dst, tblock->tm_yday + 1);
    put_list_int(&dst, tblock->tm_hour);
    put_list_int(&dst, tblock->tm_min);
    put_list_int(&dst, tblock->tm_sec);

    /* 
     *   if the timer is over 0x7fffffff, we can't represent it as an
     *   int32_t, so store it as a BigNumber value
     */
    if (timer <= 0x7fffffffU)
    {
        /* it'll fit in an ordinary 32-bit signed int */
        put_list_int(&dst, (uint32_t)timer);
    }
    else
    {
        /* it won't fit an int32, so convert to BigNumber */
        vm_obj_id_t bn;
        if (sizeof(timer) <= 4)
        {
            /* os_time_t must be a uint32 */
            bn = CVmObjBigNum::createu(vmg_ FALSE, (ulong)timer, 10);
        }
        else
        {
            /* os_time_t must be 64 bits (or larger) */
            bn = CVmObjBigNum::create_int64(
                vmg_ FALSE, (uint32_t)(timer >> 32),
                (uint32_t)(timer & 0xFFFFFFFF));
        }

        /* save it on the stack for gc protection */
        G_stk->push()->set_obj(bn);
        
        /* add it to the list */
        put_list_obj(&dst, bn);
    }

    /* create a list from the formatted buffer, and return its object ID */
    vm_obj_id_t lst = CVmObjList::create(vmg_ FALSE, buf);

    /* discard gc protection */
    G_stk->set_sp(gsp);

    /* return the list */
    return lst;
}